

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::brk_cop
               (AccessType param_1,bool param_2,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool param_1_local;
  AccessType param_0_local;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPrepareException);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePush);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePush);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePush);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPickExceptionVector);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CyclePush);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementVector);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchVector);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationPerform);
  return;
}

Assistant:

static void brk_cop(AccessType, bool, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);		// Signature.

		target(OperationPrepareException);	// Populates the data buffer; this skips a micro-op if
											// in emulation mode.

		target(CyclePush);					// PBR	[skipped in emulation mode].
		target(CyclePush);					// PCH.
		target(CyclePush);					// PCL.

		target(OperationPickExceptionVector);	// Selects the exception's target; I've assumed the same
												// logic as a 6502 here — i.e. that some interrupts can
												// usurp the vectors of others.

		target(CyclePush);					// P.

		target(CycleFetchIncrementVector);	// AAVL.
		target(CycleFetchVector);			// AAVH.

		target(OperationPerform);			// Jumps to the vector address.
	}